

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

int __thiscall
google::protobuf::Reflection::FieldSize(Reflection *this,Message *message,FieldDescriptor *field)

{
  FieldDescriptor FVar1;
  bool bVar2;
  uint32_t uVar3;
  int iVar4;
  RepeatedField<int> *pRVar5;
  MapFieldBase *this_00;
  RepeatedPtrFieldBase *pRVar6;
  LogMessage *other;
  FieldDescriptor *local_58;
  code *local_50 [7];
  
  if (*(Descriptor **)(field + 0x20) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"FieldSize","Field does not match message type.");
  }
  FVar1 = field[1];
  if ((~(byte)FVar1 & 0x60) != 0) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"FieldSize",
               "Field is singular; the method requires a repeated field.");
    FVar1 = field[1];
  }
  if (((byte)FVar1 & 8) == 0) {
    if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
      local_50[0] = FieldDescriptor::TypeOnceInit;
      local_58 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x18),local_50,&local_58);
    }
    switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4)) {
    case 1:
    case 8:
      pRVar5 = GetRaw<google::protobuf::RepeatedField<int>>(this,message,field);
      break;
    case 2:
      pRVar5 = (RepeatedField<int> *)
               GetRaw<google::protobuf::RepeatedField<long>>(this,message,field);
      break;
    case 3:
      pRVar5 = (RepeatedField<int> *)
               GetRaw<google::protobuf::RepeatedField<unsigned_int>>(this,message,field);
      break;
    case 4:
      pRVar5 = (RepeatedField<int> *)
               GetRaw<google::protobuf::RepeatedField<unsigned_long>>(this,message,field);
      break;
    case 5:
      pRVar5 = (RepeatedField<int> *)
               GetRaw<google::protobuf::RepeatedField<double>>(this,message,field);
      break;
    case 6:
      pRVar5 = (RepeatedField<int> *)
               GetRaw<google::protobuf::RepeatedField<float>>(this,message,field);
      break;
    case 7:
      pRVar5 = (RepeatedField<int> *)
               GetRaw<google::protobuf::RepeatedField<bool>>(this,message,field);
      break;
    case 9:
    case 10:
      bVar2 = anon_unknown_0::IsMapFieldInApi(field);
      if (bVar2) {
        this_00 = GetRaw<google::protobuf::internal::MapFieldBase>(this,message,field);
        bVar2 = internal::MapFieldBase::IsRepeatedFieldValid(this_00);
        if (!bVar2) {
          iVar4 = (*this_00->_vptr_MapFieldBase[0xc])(this_00);
          return iVar4;
        }
        pRVar6 = internal::MapFieldBase::GetRepeatedField(this_00);
      }
      else {
        pRVar6 = GetRaw<google::protobuf::internal::RepeatedPtrFieldBase>(this,message,field);
      }
      return pRVar6->current_size_;
    default:
      internal::LogMessage::LogMessage
                ((LogMessage *)local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x48c);
      other = internal::LogMessage::operator<<((LogMessage *)local_50,"Can\'t get here.");
      internal::LogFinisher::operator=((LogFinisher *)&local_58,other);
      internal::LogMessage::~LogMessage((LogMessage *)local_50);
      return 0;
    }
    return pRVar5->current_size_;
  }
  uVar3 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
  iVar4 = internal::ExtensionSet::ExtensionSize
                    ((ExtensionSet *)
                     ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3),
                     *(int *)(field + 4));
  return iVar4;
}

Assistant:

int Reflection::FieldSize(const Message& message,
                          const FieldDescriptor* field) const {
  USAGE_CHECK_MESSAGE_TYPE(FieldSize);
  USAGE_CHECK_REPEATED(FieldSize);
  CheckInvalidAccess(schema_, field);

  if (field->is_extension()) {
    return GetExtensionSet(message).ExtensionSize(field->number());
  } else {
    switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)    \
  case FieldDescriptor::CPPTYPE_##UPPERCASE: \
    return GetRaw<RepeatedField<LOWERCASE> >(message, field).size()

      HANDLE_TYPE(INT32, int32_t);
      HANDLE_TYPE(INT64, int64_t);
      HANDLE_TYPE(UINT32, uint32_t);
      HANDLE_TYPE(UINT64, uint64_t);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(BOOL, bool);
      HANDLE_TYPE(ENUM, int);
#undef HANDLE_TYPE

      case FieldDescriptor::CPPTYPE_STRING:
      case FieldDescriptor::CPPTYPE_MESSAGE:
        if (IsMapFieldInApi(field)) {
          const internal::MapFieldBase& map =
              GetRaw<MapFieldBase>(message, field);
          if (map.IsRepeatedFieldValid()) {
            return map.GetRepeatedField().size();
          } else {
            // No need to materialize the repeated field if it is out of sync:
            // its size will be the same as the map's size.
            return map.size();
          }
        } else {
          return GetRaw<RepeatedPtrFieldBase>(message, field).size();
        }
    }

    GOOGLE_LOG(FATAL) << "Can't get here.";
    return 0;
  }
}